

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upath.c
# Opt level: O3

ALLEGRO_PATH * get_executable_name(void)

{
  char cVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  FILE *__stream;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  ALLEGRO_USTR *us;
  size_t sVar10;
  ALLEGRO_USTR *us_00;
  ALLEGRO_PATH *pAVar11;
  int end_pos;
  long lVar12;
  stat finfo_1;
  char linkname [1024];
  char filename [1024];
  stat finfo;
  char command [1024];
  ALLEGRO_USTR_INFO AStack_d68;
  stat local_d58;
  char local_cc8 [1024];
  char local_8c8 [1024];
  stat local_4c8;
  char local_438 [1032];
  
  uVar3 = getpid();
  sprintf(local_cc8,"/proc/%d/exe",(ulong)uVar3);
  iVar4 = stat(local_cc8,&local_4c8);
  if (iVar4 == 0) {
    sVar6 = readlink(local_cc8,local_8c8,0x3ff);
    if ((int)(uint)sVar6 < 0) goto LAB_00187ae8;
    local_8c8[(uint)sVar6 & 0x7fffffff] = '\0';
  }
  else {
LAB_00187ae8:
    sprintf(local_438,"ps -p %d",(ulong)uVar3);
    __stream = popen(local_438,"r");
    if (__stream == (FILE *)0x0) {
      pcVar7 = "";
      goto LAB_00187e0c;
    }
    pcVar7 = fgets(local_cc8,0x400,__stream);
    if ((pcVar7 == (char *)0x0) &&
       (_Var2 = _al_trace_prefix("upath",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/unix/upath.c"
                                 ,0xd1,"get_executable_name"), _Var2)) {
      _al_trace_suffix("Failed to read the name of the executable file.\n");
    }
    sVar8 = strlen(local_cc8);
    pcVar7 = local_cc8 + (int)sVar8;
    while( true ) {
      iVar4 = (int)sVar8;
      if ((*pcVar7 == '\t') || (*pcVar7 == ' ')) break;
      pcVar7 = pcVar7 + -1;
      sVar8 = (size_t)(iVar4 - 1);
    }
    pcVar9 = fgets(local_cc8,0x400,__stream);
    if ((pcVar9 == (char *)0x0) &&
       (_Var2 = _al_trace_prefix("upath",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/unix/upath.c"
                                 ,0xdb,"get_executable_name"), _Var2)) {
      _al_trace_suffix("Failed to read the name of the executable file.\n");
    }
    pclose(__stream);
    cVar1 = *pcVar7;
    lVar12 = (long)(int)((uint)(cVar1 == '-') + iVar4);
    if ((local_cc8[lVar12] == '[') && (sVar8 = strlen(local_cc8), local_cc8[sVar8] == ']')) {
      local_cc8[sVar8] = '\0';
      lVar12 = (long)(int)((uint)(cVar1 == '-') + iVar4 + 1);
    }
    sVar8 = strlen(local_cc8);
    _al_sane_strncpy(local_8c8,local_cc8 + lVar12 + 1,(sVar8 - lVar12) + 1);
    pcVar7 = strchr(local_8c8,0x2f);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = getenv("PATH");
      if (pcVar7 != (char *)0x0) {
        us = al_ustr_new(pcVar7);
        iVar4 = 0;
        do {
          iVar5 = al_ustr_find_chr(us,iVar4 + 1,0x3a);
          end_pos = iVar5;
          if (iVar5 < 0) {
            sVar10 = al_ustr_size(us);
            end_pos = (int)sVar10;
          }
          us_00 = al_ref_ustr(&AStack_d68,us,iVar4,end_pos);
          pcVar7 = al_cstr(us_00);
          pAVar11 = al_create_path_for_directory(pcVar7);
          al_set_path_filename(pAVar11,local_8c8);
          pcVar7 = al_path_cstr(pAVar11,'/');
          iVar4 = stat(pcVar7,&local_d58);
          if ((iVar4 == 0) && ((local_d58.st_mode & 0xf000) != 0x4000)) {
            al_ustr_free(us);
            goto LAB_00187c9f;
          }
          al_destroy_path(pAVar11);
          iVar4 = iVar5;
        } while (-1 < iVar5);
        al_ustr_free(us);
      }
    }
    else if (local_8c8[0] == '/') {
      pAVar11 = al_create_path(local_8c8);
LAB_00187c9f:
      if (pAVar11 != (ALLEGRO_PATH *)0x0) {
        return pAVar11;
      }
    }
    else {
      pcVar7 = al_get_current_directory();
      if (pcVar7 != (char *)0x0) {
        pAVar11 = al_create_path_for_directory(pcVar7);
        al_free_with_context
                  (pcVar7,0x47,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/unix/upath.c"
                   ,"_find_executable_file");
        al_set_path_filename(pAVar11,local_8c8);
        pcVar7 = al_path_cstr(pAVar11,'/');
        iVar4 = stat(pcVar7,&local_d58);
        if ((iVar4 == 0) && ((local_d58.st_mode & 0xf000) != 0x4000)) goto LAB_00187c9f;
        al_destroy_path(pAVar11);
      }
    }
  }
  pcVar7 = local_8c8;
LAB_00187e0c:
  pAVar11 = al_create_path(pcVar7);
  return pAVar11;
}

Assistant:

static ALLEGRO_PATH *get_executable_name(void)
{
   ALLEGRO_PATH *path;

   #ifdef ALLEGRO_HAVE_GETEXECNAME
   {
      const char *s = getexecname();
      if (s) {
         if (s[0] == '/') {   /* Absolute path */
            return al_create_path(s);
         }
         else {               /* Not an absolute path */
            path = _find_executable_file(s);
            if (path)
               return path;
         }
      }
   }
   #endif

   /* We need the PID in order to query procfs */
   pid_t pid = getpid();

   /* Try a Linux-like procfs */   
   /* get symolic link to executable from proc fs */
   char linkname[1024];
   char filename[1024];
   struct stat finfo;
   sprintf(linkname, "/proc/%d/exe", (int)pid);
   if (stat(linkname, &finfo) == 0) {
      int len = readlink(linkname, filename, sizeof(filename) - 1);
      if (len > -1) {
         filename[len] = '\0';
         return al_create_path(filename);
      }
   }

   /* Use System V procfs calls if available */
#ifdef ALLEGRO_HAVE_SV_PROCFS_H
   struct prpsinfo psinfo;
   int fd;
   sprintf(linkname, "/proc/%d/exe", (int)pid);
   fd = open(linkname, O_RDONLY);
   if (fd != -1) {
      ioctl(fd, PIOCPSINFO, &psinfo);
      close(fd);
   
      /* Use argv[0] directly if we can */
#ifdef ALLEGRO_HAVE_PROCFS_ARGCV
      if (psinfo.pr_argv && psinfo.pr_argc) {
          path = _find_executable_file(psinfo.pr_argv[0]);
          if (path)
            return path;
      }
      else
#endif
      {
         /* Emulate it */
         /* We use the pr_psargs field to find argv[0]
          * This is better than using the pr_fname field because we need
          * the additional path information that may be present in argv[0]
          */
    
         /* Skip other args */
         char *s = strchr(psinfo.pr_psargs, ' ');
         if (s)
            s[0] = '\0';
         path = _find_executable_file(psinfo.pr_psargs);
         if (path)
            return path;
      }
   
      /* Try the pr_fname just for completeness' sake if argv[0] fails */
      path = _find_executable_file(psinfo.pr_fname);
      if (path)
         return path;
   }
#endif

   /* Last resort: try using the output of the ps command to at least find */
   /* the name of the file if not the full path */
   char command[1024];
   sprintf(command, "ps -p %d", (int)pid);
   FILE *pipe = popen(command, "r");
   if (pipe) {
      char* ret;
      /* The first line of output is a header */
      ret = fgets(linkname, sizeof(linkname), pipe);
      if (!ret)
         ALLEGRO_ERROR("Failed to read the name of the executable file.\n");
      
      /* The information we want is in the last column; find it */
      int len = strlen(linkname);
      while (linkname[len] != ' ' && linkname[len] != '\t')
         len--;

      /* The second line contains the info we want */
      ret = fgets(linkname, sizeof(linkname), pipe);
      if (!ret)
         ALLEGRO_ERROR("Failed to read the name of the executable file.\n");
      pclose(pipe);

      /* Treat special cases: filename between [] and - for login shell */
      if (linkname[len] == '-')
         len++;

      if (linkname[len] == '[' && linkname[strlen(linkname)] == ']') {
         len++;
         linkname[strlen(linkname)] = '\0';
      }         
      
      /* Now, the filename should be in the last column */
      _al_sane_strncpy(filename, linkname+len+1, strlen(linkname)-len+1);

      path = _find_executable_file(filename);
      if (path)
         return path;

      /* Just return the output from ps... */         
      return al_create_path(filename);
   }

   /* Give up; return empty string */
   return al_create_path("");
}